

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

cmLinkLineComputer * __thiscall
cmGlobalNinjaGenerator::CreateLinkLineComputer
          (cmGlobalNinjaGenerator *this,cmOutputConverter *outputConverter,cmStateDirectory *param_2
          )

{
  cmNinjaLinkLineComputer *this_00;
  cmStateSnapshot cStack_58;
  cmStateDirectory local_40;
  
  this_00 = (cmNinjaLinkLineComputer *)operator_new(0x48);
  cmLocalGenerator::GetStateSnapshot
            (&cStack_58,
             *(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start);
  cmStateSnapshot::GetDirectory(&local_40,&cStack_58);
  cmNinjaLinkLineComputer::cmNinjaLinkLineComputer(this_00,outputConverter,&local_40,this);
  return &this_00->super_cmLinkLineComputer;
}

Assistant:

cmLinkLineComputer* cmGlobalNinjaGenerator::CreateLinkLineComputer(
  cmOutputConverter* outputConverter,
  cmStateDirectory const& /* stateDir */) const
{
  return new cmNinjaLinkLineComputer(
    outputConverter,
    this->LocalGenerators[0]->GetStateSnapshot().GetDirectory(), this);
}